

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall PFData_test_data1_Test::TestBody(PFData_test_data1_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionResult gtest_ar;
  int retval;
  PFData test;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar3;
  allocator *val1;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff08;
  Type in_stack_ffffffffffffff0c;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff10;
  allocator local_d1;
  string local_d0 [40];
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  PFData *in_stack_ffffffffffffffb8;
  
  val1 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"badname",val1);
  PFData::PFData((PFData *)in_stack_ffffffffffffff10._M_head_impl,
                 (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  iVar2 = PFData::loadHeader(in_stack_ffffffffffffffb8);
  uVar4 = 0;
  testing::internal::CmpHelperNE<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,(int *)val1,(int *)CONCAT44(iVar2,in_stack_fffffffffffffee0))
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff08);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10._M_head_impl);
    testing::AssertionResult::failure_message((AssertionResult *)0x10efc1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff10._M_head_impl,in_stack_ffffffffffffff0c,
               (char *)CONCAT44(uVar4,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(iVar2,uVar3));
    testing::Message::~Message((Message *)0x10f00d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f04d);
  PFData::~PFData((PFData *)CONCAT44(iVar2,uVar3));
  return;
}

Assistant:

TEST_F(PFData_test, data1){
    // this file does not exist, therefore, load should fail
    PFData test("badname");
    int retval = test.loadHeader();
    EXPECT_NE(0,retval);
}